

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
handle_expired_timers_if_any
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  bool bVar1;
  pointer ptVar2;
  anon_class_8_1_8991fb9c local_20;
  unique_lock<std::mutex> *local_18;
  unique_lock<std::mutex> *acquired_lock_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  local_18 = acquired_lock;
  acquired_lock_local = (unique_lock<std::mutex> *)this;
  ptVar2 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
           operator->(&this->m_timer_manager);
  (*ptVar2->_vptr_timer_manager_t[2])();
  bVar1 = st_reusable_stuff::actual_elapsed_timers_collector_t::empty(&this->m_timers_collector);
  if (!bVar1) {
    local_20.this = this;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::handle_expired_timers_if_any(std::unique_lock<std::mutex>&)::_lambda()_1_>
              (local_18,&local_20);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::handle_expired_timers_if_any(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		// All expired timers must be collected.
		m_timer_manager->process_expired_timers();

		if( !m_timers_collector.empty() )
			// Actual handling of elapsed timers must be done
			// on unlocked env_infrastructure.
			// It is necessary because there can be an attempt to
			// deliver delayed/periodic messages into event_queue of
			// the default_dispatcher. But it is impossible to do if
			// env_infrastructure's mutex is locked.
			helpers::unlock_do_and_lock_again( acquired_lock,
				[this] {
					m_timers_collector.process();
				} );
	}